

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Geometry.cpp
# Opt level: O2

void __thiscall Assimp::AMFImporter::ParseNode_Coordinates(AMFImporter *this)

{
  bool bVar1;
  int iVar2;
  CAMFImporter_NodeElement_Coordinates *this_00;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  DeadlyImportError *this_01;
  float fVar3;
  allocator<char> local_86;
  allocator<char> local_85;
  uint local_84;
  uint local_80;
  uint local_7c;
  string local_78;
  CAMFImporter_NodeElement *ne;
  string local_50;
  
  this_00 = (CAMFImporter_NodeElement_Coordinates *)operator_new(0x60);
  CAMFImporter_NodeElement_Coordinates::CAMFImporter_NodeElement_Coordinates
            (this_00,this->mNodeElement_Cur);
  ne = (CAMFImporter_NodeElement *)this_00;
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar2 == '\0') {
    ParseHelper_Node_Enter(this,(CAMFImporter_NodeElement *)this_00);
    local_7c = 0;
    local_80 = 0;
    local_84 = 0;
    do {
      do {
        while( true ) {
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((char)iVar2 == '\0') {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_78,"coordinates",(allocator<char> *)&local_50);
            Throw_CloseNotFound(this,&local_78);
            std::__cxx11::string::~string((string *)&local_78);
            goto LAB_0035d76c;
          }
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar2 != 1) break;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_78,"x",(allocator<char> *)&local_50);
          bVar1 = XML_CheckNode_NameEqual(this,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          if (bVar1) {
            if ((local_7c & 1) != 0) {
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"x",&local_85);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_50,"Only one component can be defined.",&local_86);
              Throw_MoreThanOnceDefined(this,&local_78,&local_50);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_78);
            }
            fVar3 = XML_ReadNode_GetVal_AsFloat(this);
            (this_00->Coordinate).x = fVar3;
            local_7c = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_78,"y",(allocator<char> *)&local_50);
            bVar1 = XML_CheckNode_NameEqual(this,&local_78);
            std::__cxx11::string::~string((string *)&local_78);
            if (bVar1) {
              if ((local_80 & 1) != 0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_78,"y",&local_85);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_50,"Only one component can be defined.",&local_86);
                Throw_MoreThanOnceDefined(this,&local_78,&local_50);
                std::__cxx11::string::~string((string *)&local_50);
                std::__cxx11::string::~string((string *)&local_78);
              }
              fVar3 = XML_ReadNode_GetVal_AsFloat(this);
              (this_00->Coordinate).y = fVar3;
              local_80 = (uint)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_78,"z",(allocator<char> *)&local_50);
              bVar1 = XML_CheckNode_NameEqual(this,&local_78);
              std::__cxx11::string::~string((string *)&local_78);
              if (bVar1) {
                if ((local_84 & 1) != 0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_78,"z",&local_85);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_50,"Only one component can be defined.",&local_86);
                  Throw_MoreThanOnceDefined(this,&local_78,&local_50);
                  std::__cxx11::string::~string((string *)&local_50);
                  std::__cxx11::string::~string((string *)&local_78);
                }
                fVar3 = XML_ReadNode_GetVal_AsFloat(this);
                (this_00->Coordinate).z = fVar3;
                local_84 = (uint)CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),1);
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_78,"coordinates",(allocator<char> *)&local_50);
                XML_CheckNode_SkipUnsupported(this,&local_78);
                std::__cxx11::string::~string((string *)&local_78);
              }
            }
          }
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar2 != 2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"coordinates",(allocator<char> *)&local_50);
      bVar1 = XML_CheckNode_NameEqual(this,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
    } while (!bVar1);
LAB_0035d76c:
    ParseHelper_Node_Exit(this);
    if ((((byte)local_7c & (byte)local_80 & 1) == 0) || ((char)local_84 == '\0')) {
      this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Not all coordinate\'s components are defined.",
                 (allocator<char> *)&local_50);
      DeadlyImportError::DeadlyImportError(this_01,&local_78);
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
    push_back(&this->mNodeElement_Cur->Child,&ne);
  }
  std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
  push_back(&this->mNodeElement_List,&ne);
  return;
}

Assistant:

void AMFImporter::ParseNode_Coordinates()
{
CAMFImporter_NodeElement* ne;

	// create new color object.
	ne = new CAMFImporter_NodeElement_Coordinates(mNodeElement_Cur);

	CAMFImporter_NodeElement_Coordinates& als = *((CAMFImporter_NodeElement_Coordinates*)ne);// alias for convenience

	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		bool read_flag[3] = { false, false, false };

		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("coordinates");
			MACRO_NODECHECK_READCOMP_F("x", read_flag[0], als.Coordinate.x);
			MACRO_NODECHECK_READCOMP_F("y", read_flag[1], als.Coordinate.y);
			MACRO_NODECHECK_READCOMP_F("z", read_flag[2], als.Coordinate.z);
		MACRO_NODECHECK_LOOPEND("coordinates");
		ParseHelper_Node_Exit();
		// check that all components was defined
		if((read_flag[0] && read_flag[1] && read_flag[2]) == 0) throw DeadlyImportError("Not all coordinate's components are defined.");

	}// if(!mReader->isEmptyElement())
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}// if(!mReader->isEmptyElement()) else

	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}